

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

int c_itoa(char *buf,size_t buf_size,int64_t num,int base,int flags,int field_width)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  byte bVar9;
  bool bVar10;
  char acStack_49 [25];
  char tmp [40];
  
  uVar6 = -num;
  if (0 < num) {
    uVar6 = num;
  }
  uVar7 = CONCAT44(0,base);
  uVar5 = 0;
  do {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar7;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar6;
    bVar8 = SUB161(auVar2 % auVar1,0);
    bVar9 = bVar8 + 0x57;
    if (SUB168(auVar2 % auVar1,0) < 10) {
      bVar9 = bVar8 | 0x30;
    }
    acStack_49[uVar5 + 1] = bVar9;
    uVar5 = uVar5 + 1;
    bVar10 = uVar7 <= uVar6;
    uVar6 = uVar6 / uVar7;
  } while (bVar10);
  if (flags != 0) {
    for (; ((int)uVar5 < field_width && (uVar5 < 0x27)); uVar5 = uVar5 + 1) {
      acStack_49[uVar5 + 1] = '0';
    }
  }
  uVar4 = (uint)uVar5;
  if (num < 0) {
    lVar3 = (long)(int)uVar4;
    uVar4 = uVar4 + 1;
    acStack_49[lVar3 + 1] = '-';
  }
  lVar3 = 0;
  for (uVar6 = (ulong)uVar4; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
    if (lVar3 < (int)buf_size) {
      buf[lVar3] = acStack_49[uVar6];
    }
    lVar3 = lVar3 + 1;
  }
  return (int)lVar3;
}

Assistant:

static int c_itoa(char *buf, size_t buf_size, int64_t num, int base, int flags,
                  int field_width) {
    char tmp[40];
    int i = 0, k = 0, neg = 0;

    if (num < 0) {
        neg++;
        num = -num;
    }

    /* Print into temporary buffer - in reverse order */
    do {
        int rem = num % base;
        if (rem < 10) {
            tmp[k++] = '0' + rem;
        } else {
            tmp[k++] = 'a' + (rem - 10);
        }
        num /= base;
    } while (num > 0);

    /* Zero padding */
    if (flags && C_SNPRINTF_FLAG_ZERO) {
        while (k < field_width && k < (int) sizeof(tmp) - 1) {
            tmp[k++] = '0';
        }
    }

    /* And sign */
    if (neg) {
        tmp[k++] = '-';
    }

    /* Now output */
    while (--k >= 0) {
        C_SNPRINTF_APPEND_CHAR(tmp[k]);
    }

    return i;
}